

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::executeDefinition(Forth *this,Definition *definition)

{
  Xt XVar1;
  ostream *poVar2;
  code *pcVar3;
  AbortException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  XVar1 = this->executingWord;
  this->executingWord = definition->numberInVector;
  pcVar3 = (code *)definition->code;
  if (pcVar3 != (code *)0x0) {
    if (this->traceCalls == true) {
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)&definition->name);
      std::operator<<(poVar2," ");
      pcVar3 = (code *)definition->code;
    }
    if (((ulong)pcVar3 & 1) != 0) {
      pcVar3 = *(code **)(pcVar3 + *(long *)((long)&this->CellSize + *(long *)&definition->field_0x8
                                            ) + -1);
    }
    (*pcVar3)();
    this->executingWord = XVar1;
    return;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_58,"Word \"",&definition->name);
  std::operator+(&local_38,&bStack_58,"\" has nullptr code");
  AbortException::AbortException(this_00,&local_38);
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void executeDefinition(struct Definition definition) {
				auto saved = executingWord;
				executingWord = definition.numberInVector;
				if (definition.code) {
					if (isTraceCalls()) {
						
						std::cout << definition.name << " ";
						// int i = forth_depth();
						// std::cerr << definition.name << " " << forth_depth();
						// while (i > 0) std::cerr << " " << forth_tocell(i--  - 1);
						// std::cerr<< std::endl;
					}
					((*this).*(definition.code))();
				}
				else {
					throw AbortException("Word \""+definition.name+"\" has nullptr code");
				}
				executingWord = saved;
			}